

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet
          (OrderedTargetDependSet *this,TargetDependSet *targets,string *first)

{
  iterator __first;
  iterator __last;
  allocator<cmTargetDepend> local_6d [13];
  string local_60;
  TargetCompare local_40;
  string *local_20;
  string *first_local;
  TargetDependSet *targets_local;
  OrderedTargetDependSet *this_local;
  
  local_20 = first;
  first_local = (string *)targets;
  targets_local = (TargetDependSet *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)first);
  TargetCompare::TargetCompare(&local_40,&local_60);
  std::allocator<cmTargetDepend>::allocator(local_6d);
  std::
  multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  ::multiset(&this->
              super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
             ,&local_40,local_6d);
  std::allocator<cmTargetDepend>::~allocator(local_6d);
  TargetCompare::~TargetCompare(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  __first = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
            begin((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *
                  )first_local);
  __last = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                     ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                       *)first_local);
  std::
  multiset<cmTargetDepend,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>::
  insert<std::_Rb_tree_const_iterator<cmTargetDepend>>
            ((multiset<cmTargetDepend,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>
              *)this,(_Rb_tree_const_iterator<cmTargetDepend>)__first._M_node,
             (_Rb_tree_const_iterator<cmTargetDepend>)__last._M_node);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet(
  TargetDependSet const& targets, std::string const& first)
  : derived(TargetCompare(first))
{
  this->insert(targets.begin(), targets.end());
}